

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseBlockExpr(Parser *this)

{
  bool bVar1;
  pointer pEVar2;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  byte local_12a;
  undefined1 local_108 [16];
  string local_f8;
  undefined1 local_d2;
  allocator<char> local_d1;
  string local_d0;
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> local_b0;
  unique_ptr<enact::ExpressionStmt,_std::default_delete<enact::ExpressionStmt>_> local_a8;
  unique_ptr<enact::ExpressionStmt,_std::default_delete<enact::ExpressionStmt>_> exprStmt;
  undefined1 local_98 [8];
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> current;
  undefined1 local_78 [16];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> end;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  body;
  undefined1 local_48 [8];
  Token start;
  Parser *this_local;
  
  Token::Token((Token *)local_48,&in_RSI->m_previous);
  end._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
       (__uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>)0x0;
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
            *)&end);
  std::make_unique<enact::UnitExpr,enact::Token&>((Token *)local_78);
  std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
  unique_ptr<enact::UnitExpr,std::default_delete<enact::UnitExpr>,void>
            ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)(local_78 + 8),
             (unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)local_78);
  std::unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_>::~unique_ptr
            ((unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)local_78);
  if (local_48._0_4_ == EQUAL_GREATER) {
    parseExpr((Parser *)&current);
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator=
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)(local_78 + 8),
               (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&current);
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&current);
  }
  else if (local_48._0_4_ == LEFT_BRACE) {
    do {
      bVar1 = check(in_RSI,RIGHT_BRACE);
      local_12a = 0;
      if (!bVar1) {
        bVar1 = isAtEnd(in_RSI);
        local_12a = bVar1 ^ 0xff;
      }
      if ((local_12a & 1) == 0) break;
      parseStmt((Parser *)local_98);
      bVar1 = consume(in_RSI,SEMICOLON);
      if (bVar1) {
        std::
        vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
        ::push_back((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
                     *)&end,(value_type *)local_98);
        bVar1 = check(in_RSI,RIGHT_BRACE);
        if (bVar1) {
          exprStmt._M_t.
          super___uniq_ptr_impl<enact::ExpressionStmt,_std::default_delete<enact::ExpressionStmt>_>.
          _M_t.
          super__Tuple_impl<0UL,_enact::ExpressionStmt_*,_std::default_delete<enact::ExpressionStmt>_>
          .super__Head_base<0UL,_enact::ExpressionStmt_*,_false>._M_head_impl._4_4_ = 3;
        }
        else {
          exprStmt._M_t.
          super___uniq_ptr_impl<enact::ExpressionStmt,_std::default_delete<enact::ExpressionStmt>_>.
          _M_t.
          super__Tuple_impl<0UL,_enact::ExpressionStmt_*,_std::default_delete<enact::ExpressionStmt>_>
          .super__Head_base<0UL,_enact::ExpressionStmt_*,_false>._M_head_impl._4_4_ = 0;
        }
      }
      else {
        std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>::unique_ptr
                  (&local_b0,(unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)local_98)
        ;
        dynamic_unique_ptr_cast<enact::ExpressionStmt,enact::Stmt>((enact *)&local_a8,&local_b0);
        std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>::~unique_ptr(&local_b0);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_a8);
        if (!bVar1) {
          local_d2 = 1;
          __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,"Expected expression or \';\' at end of block.",&local_d1);
          error(__return_storage_ptr__,in_RSI,&local_d0);
          local_d2 = 0;
          __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,ParseError::~ParseError);
        }
        pEVar2 = std::unique_ptr<enact::ExpressionStmt,_std::default_delete<enact::ExpressionStmt>_>
                 ::operator->(&local_a8);
        std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator=
                  ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)(local_78 + 8),
                   &pEVar2->expr);
        std::unique_ptr<enact::ExpressionStmt,_std::default_delete<enact::ExpressionStmt>_>::
        ~unique_ptr(&local_a8);
        exprStmt._M_t.
        super___uniq_ptr_impl<enact::ExpressionStmt,_std::default_delete<enact::ExpressionStmt>_>.
        _M_t.
        super__Tuple_impl<0UL,_enact::ExpressionStmt_*,_std::default_delete<enact::ExpressionStmt>_>
        .super__Head_base<0UL,_enact::ExpressionStmt_*,_false>._M_head_impl._4_4_ = 3;
      }
      std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>::~unique_ptr
                ((unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)local_98);
    } while (exprStmt._M_t.
             super___uniq_ptr_impl<enact::ExpressionStmt,_std::default_delete<enact::ExpressionStmt>_>
             ._M_t.
             super__Tuple_impl<0UL,_enact::ExpressionStmt_*,_std::default_delete<enact::ExpressionStmt>_>
             .super__Head_base<0UL,_enact::ExpressionStmt_*,_false>._M_head_impl._4_4_ == 0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Expected \'}\' at end of block.",
               (allocator<char> *)(local_108 + 0xf));
    expect(in_RSI,RIGHT_BRACE,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)(local_108 + 0xf));
  }
  std::
  make_unique<enact::BlockExpr,std::vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
            ((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
              *)local_108,&end);
  std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
  unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>,void>
            ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
             (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_108);
  std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::~unique_ptr
            ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_108);
  exprStmt._M_t.
  super___uniq_ptr_impl<enact::ExpressionStmt,_std::default_delete<enact::ExpressionStmt>_>._M_t.
  super__Tuple_impl<0UL,_enact::ExpressionStmt_*,_std::default_delete<enact::ExpressionStmt>_>.
  super__Head_base<0UL,_enact::ExpressionStmt_*,_false>._M_head_impl._4_4_ = 1;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)(local_78 + 8));
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)&end);
  Token::~Token((Token *)local_48);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseBlockExpr() {
        Token start = m_previous;

        std::vector<std::unique_ptr<Stmt>> body{};
        std::unique_ptr<Expr> end{std::make_unique<UnitExpr>(m_previous)};

        if (start.type == TokenType::EQUAL_GREATER) {
            end = parseExpr();
        } else if (start.type == TokenType::LEFT_BRACE) {
            while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
                std::unique_ptr<Stmt> current = parseStmt();

                if (consume(TokenType::SEMICOLON)) {
                    body.push_back(std::move(current));
                    if (check(TokenType::RIGHT_BRACE)) break;
                } else {
                    if (auto exprStmt = dynamic_unique_ptr_cast<ExpressionStmt>(std::move(current))) {
                        end = std::move(exprStmt->expr);
                    } else {
                        throw error("Expected expression or ';' at end of block.");
                    }
                    break;
                }
            }

            expect(TokenType::RIGHT_BRACE, "Expected '}' at end of block.");
        }

        return std::make_unique<BlockExpr>(std::move(body), std::move(end));
    }